

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O3

void __thiscall QPrintPreviewDialogPrivate::_q_pageNumEdited(QPrintPreviewDialogPrivate *this)

{
  long lVar1;
  long in_FS_OFFSET;
  QStringView QVar2;
  bool ok;
  QArrayData *local_40;
  storage_type_conflict *local_38;
  qsizetype local_30;
  bool local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = false;
  QLineEdit::text();
  QVar2.m_data = local_38;
  QVar2.m_size = local_30;
  lVar1 = QString::toIntegral_helper(QVar2,&local_21,10);
  if ((int)lVar1 != lVar1) {
    local_21 = false;
    lVar1 = 0;
  }
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,2,0x10);
    }
  }
  if (local_21 == true) {
    QPrintPreviewWidget::setCurrentPage((QPrintPreviewWidget *)this->preview,(int)lVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::_q_pageNumEdited()
{
    bool ok = false;
    int res = pageNumEdit->text().toInt(&ok);
    if (ok)
        preview->setCurrentPage(res);
}